

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<std::complex<float>_>::CompareValues
          (TPZMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *M,
          complex<float> tol)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  double in_XMM0_Qa;
  double __x;
  double dVar4;
  double dVar5;
  complex<float> exps;
  int64_t j;
  int64_t i;
  REAL diff;
  int64_t ncols;
  int64_t nrows;
  complex<float> *in_stack_ffffffffffffff78;
  long local_48;
  long local_40;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  iVar2 = TPZBaseMatrix::Cols(in_RDI);
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  if ((iVar3 == iVar1) && (iVar3 = TPZBaseMatrix::Cols(in_RSI), iVar3 == iVar2)) {
    local_40 = 0;
    do {
      if (iVar1 <= local_40) {
        return true;
      }
      for (local_48 = 0; local_48 < iVar2; local_48 = local_48 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_40,local_48);
        (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RSI,local_40,local_48);
        std::operator-(in_stack_ffffffffffffff78,(complex<float> *)0x12aee6c);
        dVar4 = fabs(__x);
        dVar5 = fabs(in_XMM0_Qa);
        if (SUB84(dVar5,0) < SUB84(dVar4,0)) {
          return false;
        }
      }
      local_40 = local_40 + 1;
    } while( true );
  }
  return false;
}

Assistant:

bool TPZMatrix<TVar>::CompareValues(TPZMatrix<TVar> &M, TVar tol){
	
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if ( (M.Rows() != nrows) || (M.Cols() != ncols) ) return false;
	
	REAL diff;
	for( int64_t i = 0; i < nrows; i++)
		for( int64_t j = 0; j < ncols; j++){
            TVar exps = this->Get(i,j) - M.Get(i,j);
			diff = fabs( exps );
			if (diff > fabs(tol)) return false;
		}
	
	return true;
}